

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

void nn_sws_validate_utf8_chunk(nn_sws *self)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *reason;
  ulong in_RSI;
  nn_sws *pnVar5;
  nn_sws *buffer;
  ulong len;
  
  len = self->inmsg_current_chunk_len;
  buffer = (nn_sws *)self->inmsg_current_chunk_buf;
  pnVar5 = self;
  if (self->utf8_code_pt_fragment_len == 0) {
LAB_00130023:
    if (self->utf8_code_pt_fragment_len < 4) {
      do {
        if (len == 0) {
          self->utf8_code_pt_fragment_len = 0;
          self->utf8_code_pt_fragment[0] = '\0';
          self->utf8_code_pt_fragment[1] = '\0';
          self->utf8_code_pt_fragment[2] = '\0';
          self->utf8_code_pt_fragment[3] = '\0';
          if (self->is_final_frame != 0) {
            self->instate = 4;
            nn_pipebase_received(&self->pipebase);
            return;
          }
LAB_001300d7:
          nn_sws_recv_hdr(self);
          return;
        }
        in_RSI = len;
        pnVar5 = buffer;
        uVar3 = nn_utf8_code_point((uint8_t *)buffer,len);
        if ((int)uVar3 < 1) {
          if (uVar3 == 0xfffffffe) {
            self->utf8_code_pt_fragment_len = 0;
            self->utf8_code_pt_fragment[0] = '\0';
            self->utf8_code_pt_fragment[1] = '\0';
            self->utf8_code_pt_fragment[2] = '\0';
            self->utf8_code_pt_fragment[3] = '\0';
            reason = "Invalid UTF-8 code point in payload.";
            goto LAB_00130106;
          }
          if (uVar3 != 0xffffffff) {
            do {
            } while( true );
          }
          if (len < 4) {
            self->utf8_code_pt_fragment_len = len;
            memcpy(self->utf8_code_pt_fragment,buffer,len);
LAB_001300c3:
            if (self->is_final_frame == 0) goto LAB_001300d7;
            reason = "Truncated UTF-8 payload with invalid code point.";
            goto LAB_00130106;
          }
          goto LAB_00130128;
        }
        uVar4 = (ulong)uVar3;
        if (len < uVar4) {
          nn_sws_validate_utf8_chunk_cold_3();
          goto LAB_00130123;
        }
        buffer = (nn_sws *)((long)&(buffer->fsm).fn + uVar4);
        len = len - uVar4;
      } while( true );
    }
  }
  else {
    if (self->utf8_code_pt_fragment_len < 4) {
      do {
        len = len - 1;
        if (len == 0xffffffffffffffff) {
          len = 0;
          goto LAB_00130023;
        }
        self->utf8_code_pt_fragment[self->utf8_code_pt_fragment_len] = *(uint8_t *)&(buffer->fsm).fn
        ;
        in_RSI = self->utf8_code_pt_fragment_len + 1;
        self->utf8_code_pt_fragment_len = in_RSI;
        pnVar5 = (nn_sws *)self->utf8_code_pt_fragment;
        iVar2 = nn_utf8_code_point(self->utf8_code_pt_fragment,in_RSI);
        if (0 < iVar2) {
          buffer = (nn_sws *)((long)&(buffer->fsm).fn + 1);
          goto LAB_00130023;
        }
        if (iVar2 == -1) goto LAB_001300c3;
        buffer = (nn_sws *)((long)&(buffer->fsm).fn + 1);
      } while (iVar2 != -2);
      reason = "Invalid UTF-8 code point split on previous frame.";
LAB_00130106:
      nn_sws_fail_conn(self,0x3ef,reason);
      return;
    }
LAB_00130123:
    nn_sws_validate_utf8_chunk_cold_1();
LAB_00130128:
    nn_sws_validate_utf8_chunk_cold_2();
  }
  nn_sws_validate_utf8_chunk_cold_4();
  if (in_RSI == 0 || pnVar5 == (nn_sws *)0x0) {
    return;
  }
  bVar1 = *(byte *)&(pnVar5->fsm).fn;
  if (((char)bVar1 < '\0') && (0xc1 < bVar1)) {
    if (bVar1 < 0xe0) {
      if (1 < in_RSI) {
        return;
      }
    }
    else if (bVar1 < 0xf0) {
      if (in_RSI < 2) {
        return;
      }
    }
    else if (bVar1 < 0xf5) {
      if (in_RSI < 2) {
        return;
      }
      if (bVar1 == 0xf4) {
        if (0x8f < *(byte *)((long)&(pnVar5->fsm).fn + 1)) {
          return;
        }
      }
      else if ((bVar1 == 0xf0) && (*(byte *)((long)&(pnVar5->fsm).fn + 1) < 0x90)) {
        return;
      }
      if (3 < in_RSI) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void nn_sws_validate_utf8_chunk (struct nn_sws *self)
{
    uint8_t *pos;
    int code_point_len;
    size_t len;

    len = self->inmsg_current_chunk_len;
    pos = self->inmsg_current_chunk_buf;

    /*  For chunked transfers, it's possible that a previous chunk was cut
        intra-code point. That partially-validated code point is reassembled
        with the beginning of the current chunk and checked. */
    if (self->utf8_code_pt_fragment_len) {

        nn_assert (self->utf8_code_pt_fragment_len <
            NN_SWS_UTF8_MAX_CODEPOINT_LEN);

        /*  Keep adding octets from fresh buffer to previous code point
            fragment to check for validity. */
        while (len > 0) {
            self->utf8_code_pt_fragment [self->utf8_code_pt_fragment_len] = *pos;
            self->utf8_code_pt_fragment_len++;
            pos++;
            len--;

            code_point_len = nn_utf8_code_point (self->utf8_code_pt_fragment,
                self->utf8_code_pt_fragment_len);
            
            if (code_point_len > 0) {
                /*  Valid code point found; continue validating. */
                break;
            }
            else if (code_point_len == NN_SWS_UTF8_INVALID) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Invalid UTF-8 code point split on previous frame.");
                return;
            }
            else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
                if (self->is_final_frame) {
                    nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                        "Truncated UTF-8 payload with invalid code point.");
                    return;
                }
                else {
                    /*  This chunk is well-formed; now recv the next chunk. */
                    nn_sws_recv_hdr (self);
                    return;
                }
            }
        }
    }

    if (self->utf8_code_pt_fragment_len >= NN_SWS_UTF8_MAX_CODEPOINT_LEN)
        nn_assert (0);

    while (len > 0) {

        code_point_len = nn_utf8_code_point (pos, len);

        if (code_point_len > 0) {
            /*  Valid code point found; continue validating. */
            nn_assert (len >= code_point_len);
            len -= code_point_len;
            pos += code_point_len;
            continue;
        }
        else if (code_point_len == NN_SWS_UTF8_INVALID) {
            self->utf8_code_pt_fragment_len = 0;
            memset (self->utf8_code_pt_fragment, 0,
                NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                "Invalid UTF-8 code point in payload.");
            return;
        }
        else if (code_point_len == NN_SWS_UTF8_FRAGMENT) {
            nn_assert (len < NN_SWS_UTF8_MAX_CODEPOINT_LEN);
            self->utf8_code_pt_fragment_len = len;
            memcpy (self->utf8_code_pt_fragment, pos, len);
            if (self->is_final_frame) {
                nn_sws_fail_conn (self, NN_SWS_CLOSE_ERR_INVALID_FRAME,
                    "Truncated UTF-8 payload with invalid code point.");
            }
            else {
                /*  Previous frame ended in the middle of a code point;
                    receive more. */
                nn_sws_recv_hdr (self);
            }
            return;
        }
    }

    /*  Entire buffer is well-formed. */
    nn_assert (len == 0);

    self->utf8_code_pt_fragment_len = 0;
    memset (self->utf8_code_pt_fragment, 0, NN_SWS_UTF8_MAX_CODEPOINT_LEN);

    if (self->is_final_frame) {
        self->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
        nn_pipebase_received (&self->pipebase);
    }
    else {
        nn_sws_recv_hdr (self);
    }

    return;
}